

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

char * __thiscall
CVmObjStringBuffer::substr_to_string
          (CVmObjStringBuffer *this,vm_val_t *new_str,int32_t idx,int32_t len)

{
  undefined4 uVar1;
  vm_obj_id_t obj;
  int iVar2;
  vm_strbuf_ext *this_00;
  size_t sVar3;
  CVmObject *this_01;
  char *str_00;
  undefined4 extraout_var;
  vm_val_t *in_RSI;
  CVmObjStringBuffer *in_RDI;
  CVmObjString *str;
  int32_t bytelen;
  utf8_ptr p;
  vm_strbuf_ext *ext;
  int32_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  utf8_ptr in_stack_ffffffffffffffd8;
  
  this_00 = get_ext(in_RDI);
  adjust_args((CVmObjStringBuffer *)this_00,(int32_t *)in_stack_ffffffffffffffd8.p_,
              (int32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8);
  utf8_ptr::utf8_ptr((utf8_ptr *)&stack0xffffffffffffffd8);
  sVar3 = utf8_ptr::setwchars((utf8_ptr *)this_00,(wchar_t *)in_stack_ffffffffffffffd8.p_,
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (size_t)in_stack_ffffffffffffffc8);
  uVar1 = (undefined4)sVar3;
  obj = CVmObjString::create((int)((ulong)in_RSI >> 0x20),(size_t)in_RDI);
  vm_val_t::set_obj(in_RSI,obj);
  this_01 = vm_objp(0);
  str_00 = CVmObjString::cons_get_buf((CVmObjString *)this_01);
  utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffffd8,str_00);
  utf8_ptr::setwchars((utf8_ptr *)this_00,(wchar_t *)in_stack_ffffffffffffffd8.p_,
                      CONCAT44(uVar1,in_stack_ffffffffffffffd0),(size_t)this_01);
  iVar2 = (*this_01->_vptr_CVmObject[0x35])();
  return (char *)CONCAT44(extraout_var,iVar2);
}

Assistant:

const char *CVmObjStringBuffer::substr_to_string(
    VMG_ vm_val_t *new_str, int32_t idx, int32_t len) const
{
    vm_strbuf_ext *ext = get_ext();

    /* keep the arguments within our limits */
    adjust_args(&idx, &len, 0);

    /* calculate the size in bytes of the UTF-8 version of the string */
    utf8_ptr p;
    int32_t bytelen = p.setwchars(ext->buf + idx, len, 0);

    /* allocate a string */
    new_str->set_obj(CVmObjString::create(vmg_ FALSE, bytelen));
    CVmObjString *str = (CVmObjString *)vm_objp(vmg_ new_str->val.obj);

    /* translate the string to UTF-8 into the buffer */
    p.set(str->cons_get_buf());
    p.setwchars(ext->buf + idx, len, bytelen);

    /* return the new string buffer */
    return str->get_as_string(vmg0_);
}